

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall pg::Game::write_dot(Game *this,ostream *out)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  char *pcVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"digraph G {",0xb);
  cVar2 = (char)out;
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (0 < this->n_vertices) {
    uVar6 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<(out,(int)uVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [ shape=\"",10);
      pcVar4 = "box";
      bVar7 = ((this->_owner)._bits[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0;
      if (bVar7) {
        pcVar4 = "diamond";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,(ulong)bVar7 * 4 + 3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\", label=\"",10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->_priority[uVar6]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"];",3);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (this->_outedges[this->_firstouts[uVar6]] != -1) {
        piVar5 = this->_outedges + (long)this->_firstouts[uVar6] + 1;
        do {
          poVar3 = (ostream *)std::ostream::operator<<(out,(int)uVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,piVar5[-1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          iVar1 = *piVar5;
          piVar5 = piVar5 + 1;
        } while (iVar1 != -1);
      }
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < this->n_vertices);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void
Game::write_dot(std::ostream &out)
{
    out << "digraph G {" << std::endl;
    for (int i=0; i<n_vertices; i++) {
        out << i << " [ shape=\"" << (owner(i) ? "box" : "diamond")
            << "\", label=\"" << priority(i) << "\"];" << std::endl;
        for (auto curedge = outs(i); *curedge != -1; curedge++) {
            out << i << " -> " << (*curedge) << ";" << std::endl;
        }
    }
    out << "}" << std::endl;
}